

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O1

void __thiscall
QMimeBinaryProvider::addAllMimeTypes(QMimeBinaryProvider *this,QList<QMimeType> *result)

{
  byte bVar1;
  Entry *pEVar2;
  QMimeType *pQVar3;
  QArrayData *data;
  QArrayData *pQVar4;
  char16_t *pcVar5;
  ulong uVar6;
  bool bVar7;
  long lVar8;
  ulong uVar9;
  Data *pDVar10;
  const_iterator __it;
  size_t asize;
  const_iterator cVar11;
  long lVar12;
  long in_FS_OFFSET;
  QMimeTypePrivate local_60;
  QMimeType local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  loadMimeTypeList(this);
  pDVar10 = (this->m_mimetypeNames).q_hash.d;
  if ((result->d).size == 0) {
    if (pDVar10 == (Data *)0x0) {
      asize = 0;
    }
    else {
      asize = pDVar10->size;
    }
    QList<QMimeType>::reserve(result,asize);
    pDVar10 = (this->m_mimetypeNames).q_hash.d;
    if (pDVar10 == (Data *)0x0) {
      pDVar10 = (Data *)0x0;
LAB_004baca5:
      uVar9 = 0;
    }
    else {
      if (pDVar10->spans->offsets[0] != 0xff) goto LAB_004baca5;
      uVar6 = 1;
      do {
        uVar9 = uVar6;
        if (pDVar10->numBuckets == uVar9) {
          pDVar10 = (Data *)0x0;
          uVar9 = 0;
          break;
        }
        uVar6 = uVar9 + 1;
      } while (pDVar10->spans[uVar9 >> 7].offsets[(uint)uVar9 & 0x7f] == 0xff);
    }
    if (uVar9 != 0 || pDVar10 != (Data *)0x0) {
      do {
        pEVar2 = pDVar10->spans[uVar9 >> 7].entries;
        bVar1 = pDVar10->spans[uVar9 >> 7].offsets[(uint)uVar9 & 0x7f];
        local_60._0_8_ = local_60._0_8_ & 0xffffffff00000000;
        local_60.name.d.d = *(Data **)pEVar2[bVar1].storage.data;
        local_60.name.d.ptr = *(char16_t **)(pEVar2[bVar1].storage.data + 8);
        local_60.name.d.size = *(qsizetype *)(pEVar2[bVar1].storage.data + 0x10);
        if (&(local_60.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_60.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_60.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
               1;
          UNLOCK();
        }
        QMimeType::QMimeType(&local_40,&local_60);
        QtPrivate::QMovableArrayOps<QMimeType>::emplace<QMimeType>
                  ((QMovableArrayOps<QMimeType> *)result,(result->d).size,&local_40);
        QList<QMimeType>::end(result);
        QMimeType::~QMimeType(&local_40);
        if (&(local_60.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_60.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_60.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
               -1;
          UNLOCK();
          if (((local_60.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
              0) {
            QArrayData::deallocate(&(local_60.name.d.d)->super_QArrayData,2,0x10);
          }
        }
        do {
          if (pDVar10->numBuckets - 1 == uVar9) {
            uVar9 = 0;
            pDVar10 = (Data *)0x0;
            break;
          }
          uVar9 = uVar9 + 1;
        } while (pDVar10->spans[uVar9 >> 7].offsets[(uint)uVar9 & 0x7f] == 0xff);
      } while ((uVar9 != 0) || (pDVar10 != (Data *)0x0));
    }
    goto LAB_004badac;
  }
  if (pDVar10 == (Data *)0x0) {
    pDVar10 = (Data *)0x0;
LAB_004ba92b:
    uVar9 = 0;
  }
  else {
    if (pDVar10->spans->offsets[0] != 0xff) goto LAB_004ba92b;
    uVar6 = 1;
    do {
      uVar9 = uVar6;
      if (pDVar10->numBuckets == uVar9) {
        pDVar10 = (Data *)0x0;
        uVar9 = 0;
        break;
      }
      uVar6 = uVar9 + 1;
    } while (pDVar10->spans[uVar9 >> 7].offsets[(uint)uVar9 & 0x7f] == 0xff);
  }
  if (pDVar10 != (Data *)0x0 || uVar9 != 0) {
    do {
      pEVar2 = pDVar10->spans[uVar9 >> 7].entries;
      bVar1 = pDVar10->spans[uVar9 >> 7].offsets[(uint)uVar9 & 0x7f];
      pQVar3 = (result->d).ptr;
      lVar8 = (result->d).size;
      data = *(QArrayData **)pEVar2[bVar1].storage.data;
      pQVar4 = *(QArrayData **)(pEVar2[bVar1].storage.data + 8);
      pcVar5 = *(char16_t **)(pEVar2[bVar1].storage.data + 0x10);
      if (data != (QArrayData *)0x0) {
        LOCK();
        (data->ref_)._q_value.super___atomic_base<int>._M_i =
             (data->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        LOCK();
        (data->ref_)._q_value.super___atomic_base<int>._M_i =
             (data->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        LOCK();
        (data->ref_)._q_value.super___atomic_base<int>._M_i =
             (data->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        LOCK();
        (data->ref_)._q_value.super___atomic_base<int>._M_i =
             (data->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        LOCK();
        (data->ref_)._q_value.super___atomic_base<int>._M_i =
             (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(data,2,0x10);
        }
        LOCK();
        (data->ref_)._q_value.super___atomic_base<int>._M_i =
             (data->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      lVar12 = lVar8 >> 2;
      __it.i = pQVar3;
      local_60._0_8_ = data;
      local_60.name.d.d = (Data *)pQVar4;
      local_60.name.d.ptr = pcVar5;
      if (0 < lVar12) {
        lVar12 = lVar12 + 1;
        do {
          bVar7 = __gnu_cxx::__ops::
                  _Iter_pred<QMimeBinaryProvider::addAllMimeTypes(QList<QMimeType>&)::$_0>::
                  operator()((_Iter_pred<QMimeBinaryProvider::addAllMimeTypes(QList<QMimeType>&)::__0>
                              *)&local_60,__it);
          cVar11.i = __it.i;
          if (bVar7) goto LAB_004baad5;
          bVar7 = __gnu_cxx::__ops::
                  _Iter_pred<QMimeBinaryProvider::addAllMimeTypes(QList<QMimeType>&)::$_0>::
                  operator()((_Iter_pred<QMimeBinaryProvider::addAllMimeTypes(QList<QMimeType>&)::__0>
                              *)&local_60,__it.i + 1);
          cVar11.i = __it.i + 1;
          if (bVar7) goto LAB_004baad5;
          bVar7 = __gnu_cxx::__ops::
                  _Iter_pred<QMimeBinaryProvider::addAllMimeTypes(QList<QMimeType>&)::$_0>::
                  operator()((_Iter_pred<QMimeBinaryProvider::addAllMimeTypes(QList<QMimeType>&)::__0>
                              *)&local_60,__it.i + 2);
          cVar11.i = __it.i + 2;
          if (bVar7) goto LAB_004baad5;
          bVar7 = __gnu_cxx::__ops::
                  _Iter_pred<QMimeBinaryProvider::addAllMimeTypes(QList<QMimeType>&)::$_0>::
                  operator()((_Iter_pred<QMimeBinaryProvider::addAllMimeTypes(QList<QMimeType>&)::__0>
                              *)&local_60,__it.i + 3);
          cVar11.i = __it.i + 3;
          if (bVar7) goto LAB_004baad5;
          __it.i = __it.i + 4;
          lVar12 = lVar12 + -1;
        } while (1 < lVar12);
      }
      pQVar3 = pQVar3 + lVar8;
      lVar8 = (long)pQVar3 - (long)__it.i >> 3;
      if (lVar8 == 1) {
LAB_004baac2:
        bVar7 = __gnu_cxx::__ops::
                _Iter_pred<QMimeBinaryProvider::addAllMimeTypes(QList<QMimeType>&)::$_0>::operator()
                          ((_Iter_pred<QMimeBinaryProvider::addAllMimeTypes(QList<QMimeType>&)::__0>
                            *)&local_60,__it);
        cVar11.i = pQVar3;
        if (bVar7) {
          cVar11.i = __it.i;
        }
      }
      else if (lVar8 == 2) {
LAB_004baaa8:
        bVar7 = __gnu_cxx::__ops::
                _Iter_pred<QMimeBinaryProvider::addAllMimeTypes(QList<QMimeType>&)::$_0>::operator()
                          ((_Iter_pred<QMimeBinaryProvider::addAllMimeTypes(QList<QMimeType>&)::__0>
                            *)&local_60,__it);
        cVar11.i = __it.i;
        if (!bVar7) {
          __it.i = __it.i + 1;
          goto LAB_004baac2;
        }
      }
      else {
        cVar11.i = pQVar3;
        if ((lVar8 == 3) &&
           (bVar7 = __gnu_cxx::__ops::
                    _Iter_pred<QMimeBinaryProvider::addAllMimeTypes(QList<QMimeType>&)::$_0>::
                    operator()((_Iter_pred<QMimeBinaryProvider::addAllMimeTypes(QList<QMimeType>&)::__0>
                                *)&local_60,__it), cVar11.i = __it.i, !bVar7)) {
          __it.i = __it.i + 1;
          goto LAB_004baaa8;
        }
      }
LAB_004baad5:
      if ((QArrayData *)local_60._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_60._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_60._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_60._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_60._0_8_,2,0x10);
        }
      }
      if (data != (QArrayData *)0x0) {
        LOCK();
        (data->ref_)._q_value.super___atomic_base<int>._M_i =
             (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(data,2,0x10);
        }
        LOCK();
        (data->ref_)._q_value.super___atomic_base<int>._M_i =
             (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(data,2,0x10);
        }
      }
      lVar8 = (result->d).size;
      pQVar3 = (result->d).ptr;
      if (data != (QArrayData *)0x0) {
        LOCK();
        (data->ref_)._q_value.super___atomic_base<int>._M_i =
             (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(data,2,0x10);
        }
      }
      if (cVar11.i == pQVar3 + lVar8) {
        pEVar2 = pEVar2 + bVar1;
        local_60._0_8_ = local_60._0_8_ & 0xffffffff00000000;
        local_60.name.d.d = *(Data **)(pEVar2->storage).data;
        local_60.name.d.ptr = *(char16_t **)((pEVar2->storage).data + 8);
        local_60.name.d.size = *(qsizetype *)((pEVar2->storage).data + 0x10);
        if (&(local_60.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_60.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_60.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
               1;
          UNLOCK();
        }
        QMimeType::QMimeType(&local_40,&local_60);
        QtPrivate::QMovableArrayOps<QMimeType>::emplace<QMimeType>
                  ((QMovableArrayOps<QMimeType> *)result,(result->d).size,&local_40);
        QList<QMimeType>::end(result);
        QMimeType::~QMimeType(&local_40);
        if (&(local_60.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_60.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_60.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
               -1;
          UNLOCK();
          if (((local_60.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
              0) {
            QArrayData::deallocate(&(local_60.name.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      do {
        if (pDVar10->numBuckets - 1 == uVar9) {
          pDVar10 = (Data *)0x0;
          uVar9 = 0;
          break;
        }
        uVar9 = uVar9 + 1;
      } while (pDVar10->spans[uVar9 >> 7].offsets[(uint)uVar9 & 0x7f] == 0xff);
    } while ((pDVar10 != (Data *)0x0) || (uVar9 != 0));
  }
LAB_004badac:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMimeBinaryProvider::addAllMimeTypes(QList<QMimeType> &result)
{
    loadMimeTypeList();
    if (result.isEmpty()) {
        result.reserve(m_mimetypeNames.size());
        for (const QString &name : std::as_const(m_mimetypeNames))
            result.append(QMimeType(QMimeTypePrivate(name)));
    } else {
        for (const QString &name : std::as_const(m_mimetypeNames))
            if (std::find_if(result.constBegin(), result.constEnd(), [name](const QMimeType &mime) -> bool { return mime.name() == name; })
                    == result.constEnd())
                result.append(QMimeType(QMimeTypePrivate(name)));
    }
}